

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Model * gvr::loadPLY(char *name)

{
  _Rb_tree_header *p_Var1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  TexturedMesh *this;
  ulong uVar8;
  ImageIO *this_00;
  _Base_ptr p_Var9;
  int __oflag;
  string *this_01;
  TexturedMesh *pTVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  allocator local_494;
  allocator local_493;
  allocator local_492;
  allocator local_491;
  allocator local_490;
  allocator local_48f;
  allocator local_48e;
  allocator local_48d;
  allocator local_48c;
  allocator local_48b;
  allocator local_48a;
  allocator local_489;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  PLYReader ply;
  
  PLYReader::PLYReader(&ply);
  PLYReader::open(&ply,name,__oflag);
  std::__cxx11::string::string((string *)&list,"vertex",(allocator *)&s);
  lVar6 = PLYReader::instancesOfElement(&ply,(string *)&list);
  std::__cxx11::string::~string((string *)&list);
  std::__cxx11::string::string((string *)&list,"face",(allocator *)&s);
  lVar7 = PLYReader::instancesOfElement(&ply,(string *)&list);
  std::__cxx11::string::~string((string *)&list);
  std::__cxx11::string::string((string *)&list,"vertex",(allocator *)&local_310);
  std::__cxx11::string::string((string *)&s,"diffuse_red",(allocator *)&local_330);
  pVar2 = PLYReader::getTypeOfProperty(&ply,(string *)&list,&s);
  bVar11 = true;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_3d0,"vertex",(allocator *)&local_3b0);
    std::__cxx11::string::string((string *)&local_3f0,"red",(allocator *)&local_350);
    pVar2 = PLYReader::getTypeOfProperty(&ply,&local_3d0,&local_3f0);
    bVar11 = true;
    if (pVar2 == ply_none) {
      std::__cxx11::string::string((string *)&local_430,"vertex",(allocator *)&local_370);
      std::__cxx11::string::string((string *)&local_410,"r",(allocator *)&local_390);
      pVar2 = PLYReader::getTypeOfProperty(&ply,&local_430,&local_410);
      bVar11 = pVar2 != ply_none;
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
    }
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3d0);
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&list);
  std::__cxx11::string::string((string *)&list,"vertex",&local_489);
  std::__cxx11::string::string((string *)&s,"u",&local_48a);
  pVar2 = PLYReader::getTypeOfProperty(&ply,(string *)&list,&s);
  if (pVar2 == ply_none) {
LAB_00126233:
    std::__cxx11::string::string((string *)&local_430,"vertex",&local_48d);
    std::__cxx11::string::string((string *)&local_410,"texture_u",&local_48e);
    pVar3 = PLYReader::getTypeOfProperty(&ply,&local_430,&local_410);
    if (pVar3 == ply_none) {
LAB_001262dc:
      std::__cxx11::string::string((string *)&local_3b0,"vertex",&local_491);
      std::__cxx11::string::string((string *)&local_350,"s",&local_492);
      pVar4 = PLYReader::getTypeOfProperty(&ply,&local_3b0,&local_350);
      if (pVar4 == ply_none) {
        bVar12 = false;
      }
      else {
        std::__cxx11::string::string((string *)&local_370,"vertex",&local_493);
        std::__cxx11::string::string((string *)&local_390,"t",&local_494);
        pVar4 = PLYReader::getTypeOfProperty(&ply,&local_370,&local_390);
        bVar12 = pVar4 != ply_none;
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
      }
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_3b0);
      if (pVar3 != ply_none) goto LAB_001263c0;
    }
    else {
      std::__cxx11::string::string((string *)&local_310,"vertex",&local_48f);
      std::__cxx11::string::string((string *)&local_330,"texture_v",&local_490);
      pVar4 = PLYReader::getTypeOfProperty(&ply,&local_310,&local_330);
      bVar12 = true;
      if (pVar4 == ply_none) goto LAB_001262dc;
LAB_001263c0:
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_310);
    }
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    if (pVar2 != ply_none) goto LAB_001263f5;
  }
  else {
    std::__cxx11::string::string((string *)&local_3d0,"vertex",&local_48b);
    std::__cxx11::string::string((string *)&local_3f0,"v",&local_48c);
    pVar3 = PLYReader::getTypeOfProperty(&ply,&local_3d0,&local_3f0);
    bVar12 = true;
    if (pVar3 == ply_none) goto LAB_00126233;
LAB_001263f5:
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3d0);
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&list);
  std::__cxx11::string::string((string *)&list,"face",(allocator *)&local_3b0);
  std::__cxx11::string::string((string *)&s,"texcoord",(allocator *)&local_350);
  pVar2 = PLYReader::getTypeOfProperty(&ply,(string *)&list,&s);
  if (pVar2 == ply_none) {
    bVar13 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_430,"face",(allocator *)&local_370);
    std::__cxx11::string::string((string *)&local_410,"texnumber",(allocator *)&local_390);
    pVar2 = PLYReader::getTypeOfProperty(&ply,&local_430,&local_410);
    bVar13 = pVar2 != ply_none;
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&list);
  if ((int)lVar6 < 1) {
    this = (TexturedMesh *)0x0;
    goto LAB_00126797;
  }
  if ((int)lVar7 < 1) {
    if (bVar11) {
      this = (TexturedMesh *)operator_new(0xb0);
      ColoredPointCloud::ColoredPointCloud((ColoredPointCloud *)this);
    }
    else {
      this = (TexturedMesh *)operator_new(0xa8);
      PointCloud::PointCloud((PointCloud *)this);
    }
LAB_001265a7:
    pTVar10 = (TexturedMesh *)0x0;
  }
  else {
    if (bVar13) {
      this = (TexturedMesh *)operator_new(0x100);
      MultiTexturedMesh::MultiTexturedMesh((MultiTexturedMesh *)this);
      goto LAB_001265a7;
    }
    if (!bVar12) {
      if (bVar11) {
        this = (TexturedMesh *)operator_new(200);
        ColoredMesh::ColoredMesh((ColoredMesh *)this);
      }
      else {
        this = (TexturedMesh *)operator_new(0xc0);
        Mesh::Mesh((Mesh *)this);
      }
      goto LAB_001265a7;
    }
    this = (TexturedMesh *)operator_new(0x108);
    TexturedMesh::TexturedMesh(this);
    pTVar10 = this;
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[6])(this,&ply);
  if ((pTVar10 != (TexturedMesh *)0x0) && ((pTVar10->name)._M_string_length == 0)) {
    std::__cxx11::string::string((string *)&s,name,(allocator *)&list);
    uVar8 = std::__cxx11::string::rfind((char)&s,0x2e);
    if (uVar8 < s._M_string_length) {
      p_Var1 = &list._M_t._M_impl.super__Rb_tree_header;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::__cxx11::string::substr((ulong)&local_430,(ulong)&s);
      std::__cxx11::string::string((string *)&local_410,"",(allocator *)&local_3b0);
      gutil::getFileList(&list,&local_430,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      for (p_Var9 = list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
      {
        iVar5 = std::__cxx11::string::compare((string *)&s);
        if (iVar5 != 0) {
          this_00 = gimage::getImageIO();
          bVar11 = gimage::ImageIO::handlesFile(this_00,*(char **)(p_Var9 + 1),true);
          if (bVar11) {
            std::__cxx11::string::_M_assign((string *)&s);
            lVar6 = std::__cxx11::string::rfind((char)&s,0x2f);
            if (lVar6 == -1) {
              lVar6 = std::__cxx11::string::rfind((char)&s,0x5c);
              if (lVar6 != -1) goto LAB_00126712;
              std::__cxx11::string::string(local_2f0,"",(allocator *)&local_430);
              std::__cxx11::string::_M_assign((string *)&pTVar10->basepath);
              std::__cxx11::string::~string(local_2f0);
              this_01 = local_2b0;
              std::__cxx11::string::string(this_01,(string *)&s);
              std::__cxx11::string::_M_assign((string *)&pTVar10->name);
            }
            else {
LAB_00126712:
              std::__cxx11::string::substr((ulong)local_2d0,(ulong)&s);
              std::__cxx11::string::_M_assign((string *)&pTVar10->basepath);
              std::__cxx11::string::~string(local_2d0);
              this_01 = local_290;
              std::__cxx11::string::substr((ulong)this_01,(ulong)&s);
              std::__cxx11::string::_M_assign((string *)&pTVar10->name);
            }
            std::__cxx11::string::~string(this_01);
            break;
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&list._M_t);
    }
    std::__cxx11::string::~string((string *)&s);
  }
LAB_00126797:
  PLYReader::~PLYReader(&ply);
  return (Model *)this;
}

Assistant:

Model *loadPLY(const char *name)
{
  PLYReader ply;

  ply.open(name);

  // determine data type

  int vn=static_cast<int>(ply.instancesOfElement("vertex"));
  int tn=static_cast<int>(ply.instancesOfElement("face"));

  bool pervertexcolor=ply.getTypeOfProperty("vertex", "diffuse_red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "r") != ply_none;

  bool texture=(ply.getTypeOfProperty("vertex", "u") != ply_none &&
                ply.getTypeOfProperty("vertex", "v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "texture_u") != ply_none &&
                ply.getTypeOfProperty("vertex", "texture_v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "s") != ply_none &&
                ply.getTypeOfProperty("vertex", "t") != ply_none);

  bool multitexture=ply.getTypeOfProperty("face", "texcoord") != ply_none &&
                    ply.getTypeOfProperty("face", "texnumber") != ply_none;

  // create best data type

  Model *model=0;
  TexturedMesh *tm=0;

  if (vn > 0)
  {
    if (tn > 0)
    {
      if (multitexture)
      {
        model=new MultiTexturedMesh();
      }
      else if (texture)
      {
        model=tm=new TexturedMesh();
      }
      else if (pervertexcolor)
      {
        model=new ColoredMesh();
      }
      else
      {
        model=new Mesh();
      }
    }
    else
    {
      if (pervertexcolor)
      {
        model=new ColoredPointCloud();
      }
      else
      {
        model=new PointCloud();
      }
    }

    // load from PLY into the allocated data set

    model->loadPLY(ply);
  }

  // optionally try to guess the name of the texture from the file name

  if (tm != 0 && tm->getTextureName().size() == 0)
  {
    std::string s=name;
    size_t i=s.rfind('.');

    if (i < s.size())
    {
      std::set<std::string> list;
      gutil::getFileList(list, s.substr(0, i+1), "");

      for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
      {
        if (s.compare(*it) != 0  && gimage::getImageIO().handlesFile(it->c_str(), true))
        {
          s=*it;

          i=s.rfind('/');

          if (i == s.npos)
          {
            i=s.rfind('\\');
          }

          if (i != s.npos)
          {
            tm->setBasePath(s.substr(0, i+1));
            tm->setTextureName(s.substr(i+1));
          }
          else
          {
            tm->setBasePath("");
            tm->setTextureName(s);
          }

          break;
        }
      }
    }
  }

  return model;
}